

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O3

int __thiscall State::inPlace(State *this)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  
  if (0 < (long)this->height) {
    uVar2 = this->width;
    iVar6 = this->size + -1;
    lVar7 = 0;
    lVar8 = 1;
    iVar4 = 0;
    do {
      if (0 < (int)uVar2) {
        uVar5 = 0;
        do {
          iVar3 = (int)uVar5;
          piVar1 = this->tiles[lVar7] + uVar5;
          uVar5 = uVar5 + 1;
          iVar4 = iVar4 + (uint)(iVar6 == iVar3 || (int)lVar8 + iVar3 == *piVar1);
        } while (uVar2 != uVar5);
      }
      lVar7 = lVar7 + 1;
      iVar6 = iVar6 - uVar2;
      lVar8 = lVar8 + (ulong)uVar2;
    } while (lVar7 != this->height);
    return iVar4;
  }
  return 0;
}

Assistant:

int State::inPlace() {
    int score = 0;
    for (int i = 0; i < height; i++) {
        for (int j = 0; j < width; j++) {
            int value = tiles[i][j];
            int expected = 1 + i * width + j;
            if (value == expected || expected == size)
                score++;
        }
    }
    return score;
}